

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObserver.cpp
# Opt level: O3

bool __thiscall test_CEObserver::test_constructor(test_CEObserver *this)

{
  CEObserver *other;
  undefined1 uVar1;
  double elevation_m;
  CEObserver test3;
  CEObserver test2;
  CEObserver test1;
  allocator local_25d;
  undefined4 local_25c;
  double local_258;
  double local_250;
  double local_248 [4];
  CEObserver local_228;
  CEObserver local_178;
  CEObserver local_c8;
  
  CEObserver::CEObserver(&local_c8);
  local_228._vptr_CEObserver = (_func_int **)CEObserver::Longitude_Rad(&local_c8);
  local_248[0] = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"test_constructor",(allocator *)&local_258);
  local_250._0_4_ = 0x51;
  (**(code **)(*(long *)this + 0x58))(this,&local_228,local_248,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_258);
  local_228._vptr_CEObserver = (_func_int **)CEObserver::Latitude_Rad(&local_c8);
  local_248[0] = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"test_constructor",(allocator *)&local_258);
  local_250._0_4_ = 0x52;
  (**(code **)(*(long *)this + 0x58))(this,&local_228,local_248,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_258);
  local_228._vptr_CEObserver = (_func_int **)CEObserver::Temperature_C(&local_c8);
  local_248[0] = CppEphem::SeaLevelTemp_C();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"test_constructor",(allocator *)&local_258);
  local_250._0_4_ = 0x53;
  (**(code **)(*(long *)this + 0x58))(this,&local_228,local_248,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_258);
  local_228._vptr_CEObserver = (_func_int **)CEObserver::Pressure_hPa(&local_c8);
  elevation_m = CEObserver::Elevation_m(&local_c8);
  local_248[0] = CppEphem::EstimatePressure_hPa(elevation_m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"test_constructor",(allocator *)&local_258);
  local_250._0_4_ = 0x54;
  (**(code **)(*(long *)this + 0x58))(this,&local_228,local_248,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_258);
  local_228._vptr_CEObserver = (_func_int **)CEObserver::RelativeHumidity(&local_c8);
  local_248[0] = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"test_constructor",(allocator *)&local_258);
  local_250._0_4_ = 0x55;
  (**(code **)(*(long *)this + 0x58))(this,&local_228,local_248,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_258);
  local_228._vptr_CEObserver = (_func_int **)CEObserver::Wavelength_um(&local_c8);
  local_248[0] = 0.5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"test_constructor",(allocator *)&local_258);
  local_250 = (double)CONCAT44(local_250._4_4_,0x56);
  (**(code **)(*(long *)this + 0x58))(this,&local_228,local_248,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_258);
  other = &this->base_obs_;
  CEObserver::CEObserver(&local_178,other);
  local_248[0] = CEObserver::Longitude_Rad(&local_178);
  local_250 = CEObserver::Longitude_Rad(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"test_constructor",(allocator *)&local_25c);
  local_258._0_4_ = 0x5a;
  (**(code **)(*(long *)this + 0x58))(this,local_248,&local_250,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_25c);
  local_248[0] = CEObserver::Latitude_Rad(&local_178);
  local_250 = CEObserver::Latitude_Rad(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"test_constructor",(allocator *)&local_25c);
  local_258._0_4_ = 0x5b;
  (**(code **)(*(long *)this + 0x58))(this,local_248,&local_250,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_25c);
  local_248[0] = CEObserver::Temperature_K(&local_178);
  local_250 = CEObserver::Temperature_K(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"test_constructor",(allocator *)&local_25c);
  local_258._0_4_ = 0x5c;
  (**(code **)(*(long *)this + 0x58))(this,local_248,&local_250,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_25c);
  local_248[0] = CEObserver::Pressure_hPa(&local_178);
  local_250 = CEObserver::Pressure_hPa(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"test_constructor",(allocator *)&local_25c);
  local_258._0_4_ = 0x5d;
  (**(code **)(*(long *)this + 0x58))(this,local_248,&local_250,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_25c);
  local_248[0] = CEObserver::RelativeHumidity(&local_178);
  local_250 = CEObserver::RelativeHumidity(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"test_constructor",(allocator *)&local_25c);
  local_258._0_4_ = 0x5e;
  (**(code **)(*(long *)this + 0x58))(this,local_248,&local_250,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_25c);
  local_248[0] = CEObserver::Wavelength_um(&local_178);
  local_250 = CEObserver::Wavelength_um(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"test_constructor",(allocator *)&local_25c);
  local_258 = (double)CONCAT44(local_258._4_4_,0x5f);
  (**(code **)(*(long *)this + 0x58))(this,local_248,&local_250,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_25c);
  CEObserver::CEObserver(&local_228,other);
  local_250 = CEObserver::Longitude_Rad(&local_228);
  local_258 = CEObserver::Longitude_Rad(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_248,"test_constructor",&local_25d);
  local_25c = 99;
  (**(code **)(*(long *)this + 0x58))(this,&local_250,&local_258,local_248);
  std::__cxx11::string::~string((string *)local_248);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_25d);
  local_250 = CEObserver::Latitude_Rad(&local_228);
  local_258 = CEObserver::Latitude_Rad(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_248,"test_constructor",&local_25d);
  local_25c = 100;
  (**(code **)(*(long *)this + 0x58))(this,&local_250,&local_258,local_248);
  std::__cxx11::string::~string((string *)local_248);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_25d);
  local_250 = CEObserver::Temperature_K(&local_228);
  local_258 = CEObserver::Temperature_K(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_248,"test_constructor",&local_25d);
  local_25c = 0x65;
  (**(code **)(*(long *)this + 0x58))(this,&local_250,&local_258,local_248);
  std::__cxx11::string::~string((string *)local_248);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_25d);
  local_250 = CEObserver::Pressure_hPa(&local_228);
  local_258 = CEObserver::Pressure_hPa(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_248,"test_constructor",&local_25d);
  local_25c = 0x66;
  (**(code **)(*(long *)this + 0x58))(this,&local_250,&local_258,local_248);
  std::__cxx11::string::~string((string *)local_248);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_25d);
  local_250 = CEObserver::RelativeHumidity(&local_228);
  local_258 = CEObserver::RelativeHumidity(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_248,"test_constructor",&local_25d);
  local_25c = 0x67;
  (**(code **)(*(long *)this + 0x58))(this,&local_250,&local_258,local_248);
  std::__cxx11::string::~string((string *)local_248);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_25d);
  local_250 = CEObserver::Wavelength_um(&local_228);
  local_258 = CEObserver::Wavelength_um(other);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_248,"test_constructor",&local_25d);
  local_25c = 0x68;
  (**(code **)(*(long *)this + 0x58))(this,&local_250,&local_258,local_248);
  std::__cxx11::string::~string((string *)local_248);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_25d);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  CEObserver::~CEObserver(&local_228);
  CEObserver::~CEObserver(&local_178);
  CEObserver::~CEObserver(&local_c8);
  return (bool)uVar1;
}

Assistant:

bool test_CEObserver::test_constructor(void)
{
    // Default constructor
    CEObserver test1;
    test_double(test1.Longitude_Rad(), 0.0, __func__, __LINE__);
    test_double(test1.Latitude_Rad(),  0.0,  __func__, __LINE__);
    test_double(test1.Temperature_C(), CppEphem::SeaLevelTemp_C(), __func__, __LINE__);
    test_double(test1.Pressure_hPa(),  CppEphem::EstimatePressure_hPa(test1.Elevation_m()),  __func__, __LINE__);
    test_double(test1.RelativeHumidity(), 0.0, __func__, __LINE__);
    test_double(test1.Wavelength_um(), 0.5, __func__, __LINE__);

    // Create a copy for testing
    CEObserver test2(base_obs_);
    test_double(test2.Longitude_Rad(), base_obs_.Longitude_Rad(), __func__, __LINE__);
    test_double(test2.Latitude_Rad(),  base_obs_.Latitude_Rad(),  __func__, __LINE__);
    test_double(test2.Temperature_K(), base_obs_.Temperature_K(), __func__, __LINE__);
    test_double(test2.Pressure_hPa(),  base_obs_.Pressure_hPa(),  __func__, __LINE__);
    test_double(test2.RelativeHumidity(), base_obs_.RelativeHumidity(), __func__, __LINE__);
    test_double(test2.Wavelength_um(), base_obs_.Wavelength_um(), __func__, __LINE__);

    // Copy assignment operator
    CEObserver test3 = base_obs_;
    test_double(test3.Longitude_Rad(), base_obs_.Longitude_Rad(), __func__, __LINE__);
    test_double(test3.Latitude_Rad(),  base_obs_.Latitude_Rad(),  __func__, __LINE__);
    test_double(test3.Temperature_K(), base_obs_.Temperature_K(), __func__, __LINE__);
    test_double(test3.Pressure_hPa(),  base_obs_.Pressure_hPa(),  __func__, __LINE__);
    test_double(test3.RelativeHumidity(), base_obs_.RelativeHumidity(), __func__, __LINE__);
    test_double(test3.Wavelength_um(), base_obs_.Wavelength_um(), __func__, __LINE__);

    return pass();
}